

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * wasm::saturating_narrow<signed_char>(Literal *__return_storage_ptr__,type val)

{
  char cVar1;
  undefined2 local_12;
  type val_local;
  
  cVar1 = std::numeric_limits<signed_char>::max();
  if (cVar1 < val) {
    cVar1 = std::numeric_limits<signed_char>::max();
    local_12 = (type)cVar1;
  }
  else {
    cVar1 = std::numeric_limits<signed_char>::min();
    local_12 = val;
    if (val < cVar1) {
      cVar1 = std::numeric_limits<signed_char>::min();
      local_12 = (type)cVar1;
    }
  }
  Literal::Literal(__return_storage_ptr__,(int)local_12);
  return __return_storage_ptr__;
}

Assistant:

Literal saturating_narrow(
  typename TwiceWidth<typename std::make_signed<T>::type>::type val) {
  using WideT = typename TwiceWidth<typename std::make_signed<T>::type>::type;
  if (val > WideT(std::numeric_limits<T>::max())) {
    val = std::numeric_limits<T>::max();
  } else if (val < WideT(std::numeric_limits<T>::min())) {
    val = std::numeric_limits<T>::min();
  }
  return Literal(int32_t(val));
}